

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

void cJSON_AddItemToObjectCS(cJSON *object,char *string,cJSON *item)

{
  cJSON *pcVar1;
  uint uVar2;
  cJSON *pcVar3;
  
  if (item != (cJSON *)0x0) {
    uVar2 = item->type;
    if (((uVar2 >> 9 & 1) == 0) && (item->string != (char *)0x0)) {
      (*global_hooks.deallocate)(item->string);
      uVar2 = item->type;
    }
    item->string = string;
    item->type = uVar2 | 0x200;
    if (object != (cJSON *)0x0) {
      pcVar1 = object->child;
      if (object->child == (cJSON *)0x0) {
        object->child = item;
      }
      else {
        do {
          pcVar3 = pcVar1;
          pcVar1 = pcVar3->next;
        } while (pcVar3->next != (cJSON *)0x0);
        pcVar3->next = item;
        item->prev = pcVar3;
      }
    }
  }
  return;
}

Assistant:

CJSON_PUBLIC(void) cJSON_AddItemToObjectCS(cJSON *object, const char *string, cJSON *item)
{
    if (!item)
    {
        return;
    }
    if (!(item->type & cJSON_StringIsConst) && item->string)
    {
        global_hooks.deallocate(item->string);
    }
    item->string = (char*)string;
    item->type |= cJSON_StringIsConst;
    cJSON_AddItemToArray(object, item);
}